

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamWriter.cpp
# Opt level: O1

void __thiscall Js::StreamWriter::Write(StreamWriter *this,void *pv,size_t cb)

{
  ScriptContext *scriptContext;
  ThreadContext *pTVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 *puVar6;
  void *__frameAddr;
  uint uVar7;
  undefined1 local_70 [8];
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  
  uVar7 = (uint)this->m_current;
  uVar4 = uVar7 + (uint)cb;
  if (!CARRY4(uVar7,(uint)cb)) {
    if ((ulong)uVar4 < this->m_capacity) {
LAB_00f241f3:
      if (this->m_buffer == (byte *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/StreamWriter.cpp"
                                    ,0x18,"(m_buffer != nullptr)","m_buffer != nullptr");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      js_memcpy_s(this->m_buffer + this->m_current,cb,pv,cb);
      this->m_current = this->m_current + cb;
      return;
    }
    iVar5 = (int)this->m_capacity;
    if (-1 < iVar5) {
      uVar7 = iVar5 * 2;
      if (uVar7 < uVar4) {
        uVar7 = uVar4;
      }
      if (uVar7 < 0xffffff9c) {
        scriptContext = (this->super_ScriptContextHolder).m_scriptContext;
        __leaveScriptObject._32_8_ = &this->m_capacity;
        LeaveScriptObject<true,_true,_false>::LeaveScriptObject
                  ((LeaveScriptObject<true,_true,_false> *)local_70,scriptContext,
                   &stack0xfffffffffffffff8);
        pTVar1 = scriptContext->threadContext;
        bVar3 = pTVar1->reentrancySafeOrHandled;
        pTVar1->reentrancySafeOrHandled = true;
        iVar5 = (**this->m_stream->_vptr_HostStream)
                          (this->m_stream,this->m_buffer,(ulong)(uVar7 + 100),
                           __leaveScriptObject._32_8_);
        this->m_buffer = (byte *)CONCAT44(extraout_var,iVar5);
        ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
        pTVar1->reentrancySafeOrHandled = bVar3;
        LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
                  ((LeaveScriptObject<true,_true,_false> *)local_70);
        goto LAB_00f241f3;
      }
    }
  }
  ::Math::DefaultOverflowPolicy();
}

Assistant:

void StreamWriter::Write(const void* pv, size_t cb)
    {
        ScriptContext* scriptContext = GetScriptContext();
        uint32 newSize = UInt32Math::Add((uint32)m_current, (uint32)cb);
        if (newSize >= m_capacity)
        {
            size_t newCapacity = UInt32Math::Add(max(newSize, UInt32Math::Mul((uint32)m_capacity, 2)), 100);
            BEGIN_LEAVE_SCRIPT(scriptContext)
            {
                m_buffer = m_stream->ExtendBuffer(m_buffer, newCapacity, &m_capacity);
            }
            END_LEAVE_SCRIPT(scriptContext);
        }

        Assert(m_buffer != nullptr);
        js_memcpy_s(m_buffer + m_current, cb, pv, cb);
        m_current += cb;
    }